

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool unplugGroup(QMainWindowLayout *layout,QLayoutItem **item,QDockAreaLayoutItem *parentItem)

{
  QDockAreaLayoutInfo *this;
  bool bVar1;
  QDockWidgetGroupWindow *this_00;
  QLayout *pQVar2;
  QWidget *this_01;
  QLayoutItem *pQVar3;
  int __sig;
  long in_FS_OFFSET;
  QPoint local_50;
  QRect local_48;
  long local_38;
  QRect *r;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((parentItem->subinfo == (QDockAreaLayoutInfo *)0x0) || (parentItem->subinfo->tabbed != true))
  {
    bVar1 = false;
  }
  else {
    this_00 = QMainWindowLayout::createTabbedDockWindow((QMainWindowLayout *)layout);
    pQVar2 = QWidget::layout(&this_00->super_QWidget);
    QDockAreaLayoutInfo::operator=
              ((QDockAreaLayoutInfo *)&pQVar2[4].super_QLayoutItem,parentItem->subinfo);
    this = parentItem->subinfo;
    if (this != (QDockAreaLayoutInfo *)0x0) {
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo(this);
    }
    operator_delete(this,0x70);
    parentItem->subinfo = (QDockAreaLayoutInfo *)0x0;
    this_01 = QLayout::parentWidget(&layout->super_QLayout);
    local_50 = QWidget::pos(this_01);
    local_48 = QRect::translated((QRect *)&pQVar2[5].super_QLayoutItem.align,&local_50);
    r = &local_48;
    QWidget::setGeometry(&this_00->super_QWidget,r);
    __sig = (int)r;
    QWidget::show(&this_00->super_QWidget);
    QWidget::raise(&this_00->super_QWidget,__sig);
    pQVar3 = (QLayoutItem *)operator_new(0x18);
    (pQVar3->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
    pQVar3[1]._vptr_QLayoutItem = (_func_int **)this_00;
    pQVar3->_vptr_QLayoutItem = (_func_int **)&PTR__QWidgetItem_007cbf10;
    *item = pQVar3;
    parentItem->widgetItem = pQVar3;
    bVar1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool unplugGroup(QMainWindowLayout *layout, QLayoutItem **item,
                        QDockAreaLayoutItem &parentItem)
{
    if (!parentItem.subinfo || !parentItem.subinfo->tabbed)
        return false;

    // The QDockWidget is part of a group of tab and we need to unplug them all.
    QDockWidgetGroupWindow *floatingTabs = layout->createTabbedDockWindow();
    QDockAreaLayoutInfo *info = floatingTabs->layoutInfo();
    *info = std::move(*parentItem.subinfo);
    delete parentItem.subinfo;
    parentItem.subinfo = nullptr;
    floatingTabs->setGeometry(info->rect.translated(layout->parentWidget()->pos()));
    floatingTabs->show();
    floatingTabs->raise();
    *item = new QDockWidgetGroupWindowItem(floatingTabs);
    parentItem.widgetItem = *item;
    return true;
}